

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLineStripPointsNonindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  long lVar1;
  uint uVar2;
  AdjacencyGrid *pAVar3;
  AdjacencyGridPoint *pAVar4;
  GLfloat *pGVar5;
  GLfloat *pGVar6;
  GLfloat *pGVar7;
  GLfloat *pGVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  
  pAVar3 = test_data->m_grid;
  uVar2 = (pAVar3->m_line_strip).m_n_points;
  test_data->m_n_vertices = uVar2;
  uVar13 = (uVar2 * 8 + -0x18) * this->m_n_components_output;
  test_data->m_geometry_bo_size = uVar13;
  uVar12 = this->m_n_components_input * uVar2 * 4;
  test_data->m_vertex_data_bo_size = uVar12;
  pGVar5 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_adjacency_geometry = pGVar5;
  pGVar6 = (GLfloat *)operator_new__((ulong)uVar13);
  test_data->m_expected_geometry = pGVar6;
  pGVar7 = (GLfloat *)operator_new__((ulong)uVar12);
  test_data->m_vertex_data = pGVar7;
  if ((ulong)uVar2 != 0) {
    pGVar8 = &((pAVar3->m_line_strip).m_points)->y;
    uVar9 = 0;
    do {
      pGVar7[uVar9 * 2] = pGVar8[-1];
      pGVar7[uVar9 * 2 + 1] = *pGVar8;
      uVar9 = uVar9 + 1;
      pGVar8 = pGVar8 + 3;
    } while (uVar2 != uVar9);
  }
  if (uVar2 - 3 != 0) {
    pAVar4 = (pAVar3->m_line_strip).m_points;
    pGVar7 = &pAVar4[1].y;
    uVar9 = 2;
    lVar10 = 0;
    do {
      *(GLfloat *)((long)pGVar5 + lVar10) = pGVar7[-4];
      *(GLfloat *)((long)pGVar5 + lVar10 + 4) = pGVar7[-3];
      *(undefined8 *)((long)pGVar5 + lVar10 + 8) = 0x3f80000000000000;
      uVar11 = uVar9 & 0xffffffff;
      lVar1 = (1 - (ulong)(uVar2 - 3)) + uVar9;
      uVar9 = uVar9 + 1;
      *(GLfloat *)((long)pGVar5 + lVar10 + 0x10) = pAVar4[uVar9 & 0xffffffff].x;
      *(GLfloat *)((long)pGVar5 + lVar10 + 0x14) = pAVar4[uVar9 & 0xffffffff].y;
      *(undefined8 *)((long)pGVar5 + lVar10 + 0x18) = 0x3f80000000000000;
      *(GLfloat *)((long)pGVar6 + lVar10) = pGVar7[-1];
      *(GLfloat *)((long)pGVar6 + lVar10 + 4) = *pGVar7;
      *(undefined8 *)((long)pGVar6 + lVar10 + 8) = 0x3f80000000000000;
      *(GLfloat *)((long)pGVar6 + lVar10 + 0x10) = pAVar4[uVar11].x;
      *(GLfloat *)((long)pGVar6 + lVar10 + 0x14) = pAVar4[uVar11].y;
      *(undefined8 *)((long)pGVar6 + lVar10 + 0x18) = 0x3f80000000000000;
      pGVar7 = pGVar7 + 3;
      lVar10 = lVar10 + 0x20;
    } while (lVar1 != 2);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLineStripPointsNonindiced(AdjacencyTestData& test_data)
{
	float* travellerExpectedAdjacencyGeometryPtr = 0;
	float* travellerExpectedGeometryPtr			 = 0;
	float* travellerPtr							 = 0;

	/* Set buffer sizes */
	test_data.m_n_vertices		 = test_data.m_grid->m_line_strip.m_n_points;
	test_data.m_geometry_bo_size = static_cast<glw::GLuint>((test_data.m_n_vertices - 3) * m_n_components_output *
															2 /* start/end */ * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_input * sizeof(float));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_n_vertices; ++n)
	{
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_n_vertices - 3; ++n)
	{
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 3].y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 1].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = test_data.m_grid->m_line_strip.m_points[n + 2].y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all vertices (apart from the three last ones) ) */
}